

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_dump(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pVal;
  sxu32 sVar1;
  char *zSrc;
  ulong uVar2;
  SyBlob sDump;
  
  sDump.pAllocator = &pCtx->pVm->sAllocator;
  sDump.pBlob = (void *)0x0;
  sDump.nByte = 0;
  sDump.mByte = 0;
  sDump.nFlags = 0;
  if (nArg < 1) {
    nArg = 0;
  }
  for (uVar2 = 0; (uint)nArg != uVar2; uVar2 = uVar2 + 1) {
    pVal = apArg[uVar2];
    sDump._16_8_ = sDump._16_8_ & 0xffffffff00000000;
    if ((sDump.nFlags & 4) != 0) {
      sDump.pBlob = (void *)0x0;
      sDump.nByte = 0;
      sDump.mByte = 0;
      sDump.nFlags = sDump.nFlags & 0xfffffffb;
    }
    zSrc = jx9MemObjTypeDump(pVal);
    sVar1 = SyStrlen(zSrc);
    SyBlobAppend(&sDump,zSrc,sVar1);
    if ((pVal->iFlags & 0x20) == 0) {
      SyBlobAppend(&sDump,"(",1);
      if ((pVal->iFlags & 0x40U) == 0) {
        if ((pVal->iFlags & 1U) == 0) {
          MemObjStringValue(&sDump,pVal);
        }
        else {
          SyBlobFormat(&sDump,"%u \'",(ulong)(pVal->sBlob).nByte);
          sVar1 = (pVal->sBlob).nByte;
          if (sVar1 != 0) {
            SyBlobAppend(&sDump,(pVal->sBlob).pBlob,sVar1);
          }
          SyBlobAppend(&sDump,"\'",1);
        }
      }
      else {
        SyBlobFormat(&sDump,"%u ",(ulong)*(uint *)((pVal->x).iVal + 0x2c));
        jx9JsonSerialize(pVal,&sDump);
      }
      SyBlobAppend(&sDump,")",1);
    }
    SyBlobAppend(&sDump,"\n",1);
    if (sDump.nByte != 0) {
      jx9_context_output(pCtx,(char *)sDump.pBlob,sDump.nByte);
    }
  }
  SyBlobRelease(&sDump);
  return 0;
}

Assistant:

static int vm_builtin_dump(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyBlob sDump; /* Generated dump is stored here */
	int i;
	SyBlobInit(&sDump,&pCtx->pVm->sAllocator);
	/* Dump one or more expressions */
	for( i = 0 ; i < nArg ; i++ ){
		jx9_value *pObj = apArg[i];
		/* Reset the working buffer */
		SyBlobReset(&sDump);
		/* Dump the given expression */
		jx9MemObjDump(&sDump,pObj);
		/* Output */
		if( SyBlobLength(&sDump) > 0 ){
			jx9_context_output(pCtx, (const char *)SyBlobData(&sDump), (int)SyBlobLength(&sDump));
		}
	}
	/* Release the working buffer */
	SyBlobRelease(&sDump);
	return SXRET_OK;
}